

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O3

void __thiscall diy::Master::~Master(Master *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer piVar1;
  pointer ppLVar2;
  
  if (this->immediate_ == false) {
    execute(this);
  }
  this->immediate_ = true;
  clear(this);
  if (this->queue_policy_ != (QueuePolicy *)0x0) {
    (*this->queue_policy_->_vptr_QueuePolicy[3])();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->prof).total.duration._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&this->prof);
  this_00 = (this->log).super___shared_ptr<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::
  vector<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
  ::~vector(&this->commands_);
  std::unique_ptr<diy::Master::CollectivesMap,_std::default_delete<diy::Master::CollectivesMap>_>::
  ~unique_ptr(&this->collectives_);
  std::
  unique_ptr<diy::Master::InFlightRecvsMap,_std::default_delete<diy::Master::InFlightRecvsMap>_>::
  ~unique_ptr(&this->inflight_recvs_);
  std::
  unique_ptr<diy::Master::InFlightSendsList,_std::default_delete<diy::Master::InFlightSendsList>_>::
  ~unique_ptr(&this->inflight_sends_);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>,_std::_Select1st<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
  ::~_Rb_tree(&(this->outgoing_)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_diy::Master::IncomingRound>,_std::_Select1st<std::pair<const_int,_diy::Master::IncomingRound>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
  ::~_Rb_tree(&(this->incoming_)._M_t);
  mpi::communicator::~communicator(&this->comm_);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->lids_)._M_t);
  piVar1 = (this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  Collection::~Collection(&this->blocks_);
  ppLVar2 = (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2,(long)(this->links_).
                                  super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2)
    ;
    return;
  }
  return;
}

Assistant:

diy::Master::
~Master()
{
    set_immediate(true);
    clear();
    delete queue_policy_;
}